

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

void __thiscall
clipp::group::depth_first_traverser::depth_first_traverser(depth_first_traverser *this,group *cur)

{
  (this->stack_).
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack_).
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack_).
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((cur->children_).
      super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (cur->children_).
      super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>
    ::emplace_back<clipp::group_const&>
              ((vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>
                *)this,cur);
  }
  return;
}

Assistant:

explicit constexpr
    subrange() noexcept :
        at_{arg_string::npos}, length_{0}
    {}